

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConnection.cxx
# Opt level: O2

void __thiscall cmEventBasedConnection::WriteData(cmEventBasedConnection *this,string *_data)

{
  cmServerBase *pcVar1;
  cmConnectionBufferStrategy *pcVar2;
  uint __line;
  int iVar3;
  uv_stream_s *puVar4;
  uv_write_t *req;
  char *pcVar5;
  uv_buf_t uVar6;
  uv_thread_t curr_thread_id;
  string data;
  string local_40 [32];
  
  curr_thread_id = uv_thread_self();
  pcVar1 = (this->super_cmConnection).Server;
  if (pcVar1 == (cmServerBase *)0x0) {
    pcVar5 = "this->Server";
    __line = 0x4a;
  }
  else {
    iVar3 = uv_thread_equal(&curr_thread_id,&pcVar1->ServeThreadId);
    if (iVar3 == 0) {
      pcVar5 = "uv_thread_equal(&curr_thread_id, &this->Server->ServeThreadId)";
      __line = 0x4b;
    }
    else {
      std::__cxx11::string::string((string *)&data,(string *)_data);
      puVar4 = ::cm::uv_handle_ptr_base_<uv_stream_s>::get
                         (&(this->WriteStream).super_uv_handle_ptr_base_<uv_stream_s>);
      if (puVar4 != (uv_stream_s *)0x0) {
        pcVar2 = (this->BufferStrategy)._M_t.
                 super___uniq_ptr_impl<cmConnectionBufferStrategy,_std::default_delete<cmConnectionBufferStrategy>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmConnectionBufferStrategy_*,_std::default_delete<cmConnectionBufferStrategy>_>
                 .super__Head_base<0UL,_cmConnectionBufferStrategy_*,_false>._M_head_impl;
        if (pcVar2 != (cmConnectionBufferStrategy *)0x0) {
          (*pcVar2->_vptr_cmConnectionBufferStrategy[3])(local_40,pcVar2,&data);
          std::__cxx11::string::operator=((string *)&data,local_40);
          std::__cxx11::string::~string(local_40);
        }
        req = (uv_write_t *)operator_new(0xd0);
        req->data = this;
        pcVar5 = (char *)operator_new__(data._M_string_length);
        uVar6 = uv_buf_init(pcVar5,(uint)data._M_string_length);
        *(uv_buf_t *)(req + 1) = uVar6;
        memcpy(uVar6.base,data._M_dataplus._M_p,data._M_string_length);
        puVar4 = ::cm::uv_handle_ptr_::operator_cast_to_uv_stream_s_(&this->WriteStream);
        uv_write(req,puVar4,(uv_buf_t *)(req + 1),1,on_write);
        std::__cxx11::string::~string((string *)&data);
        return;
      }
      pcVar5 = "this->WriteStream.get()";
      __line = 0x4f;
    }
  }
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmConnection.cxx"
                ,__line,"virtual void cmEventBasedConnection::WriteData(const std::string &)");
}

Assistant:

void cmEventBasedConnection::WriteData(const std::string& _data)
{
#ifndef NDEBUG
  auto curr_thread_id = uv_thread_self();
  assert(this->Server);
  assert(uv_thread_equal(&curr_thread_id, &this->Server->ServeThreadId));
#endif

  auto data = _data;
  assert(this->WriteStream.get());
  if (BufferStrategy) {
    data = BufferStrategy->BufferOutMessage(data);
  }

  auto ds = data.size();

  write_req_t* req = new write_req_t;
  req->req.data = this;
  req->buf = uv_buf_init(new char[ds], static_cast<unsigned int>(ds));
  memcpy(req->buf.base, data.c_str(), ds);
  uv_write(reinterpret_cast<uv_write_t*>(req), this->WriteStream, &req->buf, 1,
           on_write);
}